

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O0

void __thiscall lts2::LBDOperator::ApplyConjugate(LBDOperator *this,Mat *X,Mat *AstarX)

{
  _InputArray *p_Var1;
  double local_148;
  Scalar_<double> local_140;
  _InputArray local_120;
  uint local_104;
  float *pfStack_100;
  int i;
  float *p_x;
  Size_<int> local_d8;
  undefined1 local_d0 [8];
  Mat basisImage;
  Scalar_<double> local_60;
  _InputArray local_40;
  Size_<int> local_28;
  _InputArray *local_20;
  Mat *AstarX_local;
  Mat *X_local;
  LBDOperator *this_local;
  
  local_20 = (_InputArray *)AstarX;
  AstarX_local = X;
  X_local = (Mat *)this;
  cv::Size_<int>::Size_(&local_28,&this->_patchSize);
  cv::Mat::create(AstarX,&local_28,5);
  p_Var1 = local_20;
  cv::Scalar_<double>::Scalar_(&local_60,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_40,(Matx<double,_4,_1> *)&local_60);
  cv::noArray();
  cv::Mat::setTo(p_Var1,&local_40);
  cv::_InputArray::~_InputArray(&local_40);
  cv::Size_<int>::Size_(&local_d8,&this->_patchSize);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&p_x,0.0);
  cv::Mat::Mat((Mat *)local_d0,&local_d8,5,(Scalar_<double> *)&p_x);
  pfStack_100 = cv::Mat::ptr<float>(AstarX_local,0);
  for (local_104 = 0; local_104 < *(uint *)&(this->super_LinearOperator).field_0xc;
      local_104 = local_104 + 1) {
    cv::Scalar_<double>::Scalar_(&local_140,0.0);
    cv::_InputArray::_InputArray<double,4,1>(&local_120,(Matx<double,_4,_1> *)&local_140);
    cv::noArray();
    cv::Mat::setTo((_InputArray *)local_d0,&local_120);
    cv::_InputArray::~_InputArray(&local_120);
    fillBasisFunctionForIndex(this,(Mat *)local_d0,local_104);
    local_148 = (double)*pfStack_100;
    cv::operator*=((Mat *)local_d0,&local_148);
    pfStack_100 = pfStack_100 + 1;
    cv::operator+=((Mat *)local_20,(Mat *)local_d0);
  }
  cv::Mat::~Mat((Mat *)local_d0);
  return;
}

Assistant:

void lts2::LBDOperator::ApplyConjugate(cv::Mat const& X, cv::Mat& AstarX)
{
    // The output is an image (actually, a patch)
    AstarX.create(_patchSize, CV_32F);
    AstarX.setTo(cv::Scalar(0));

    // Stub to hold the current image basis function: we will write
    // each basis function into it
    cv::Mat basisImage(_patchSize, CV_32F, cv::Scalar(0));
    
    // Coordinate value
    float const* p_x = X.ptr<float>(0);
    
    // Sum over the basis functions
    for (int i = 0; i < _pairsInUse; ++i)
    {
        // Reset
        basisImage.setTo(cv::Scalar(0));
        
        // Add "nominal" basis function
        fillBasisFunctionForIndex(basisImage, i);
        
        // Apply the amplitude
        basisImage *= (*p_x);
        ++p_x;
        
        // Sum
        AstarX += basisImage;
    }
}